

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<12,_2,_13,_0,_13>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  int row;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Mat4 m;
  float afStack_150 [6];
  float local_138 [4];
  float local_128 [2];
  ulong local_120;
  undefined4 local_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  float local_e4;
  undefined8 local_e0;
  Matrix<float,_4,_4> local_d8;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_84;
  undefined4 local_7c;
  undefined4 local_78;
  undefined8 local_70;
  undefined8 local_68;
  float local_5c;
  Matrix<float,_4,_4> local_58;
  
  pfVar1 = (float *)&local_d8;
  lVar2 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar6 = 0x3f800000;
      if (lVar2 != lVar5) {
        uVar6 = 0;
      }
      *(undefined4 *)((long)pfVar1 + lVar5) = uVar6;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    lVar4 = lVar4 + 1;
    pfVar1 = pfVar1 + 1;
    lVar2 = lVar2 + 0x10;
  } while (lVar4 != 4);
  local_d8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  local_d8.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
  local_d8.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
  local_d8.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  local_d8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  local_d8.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  local_d8.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
  local_d8.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  pfVar1 = (float *)&local_58;
  local_58.m_data.m_data[3].m_data[0] = 0.0;
  local_58.m_data.m_data[3].m_data[1] = 0.0;
  local_58.m_data.m_data[3].m_data[2] = 0.0;
  local_58.m_data.m_data[3].m_data[3] = 0.0;
  local_58.m_data.m_data[2].m_data[0] = 0.0;
  local_58.m_data.m_data[2].m_data[1] = 0.0;
  local_58.m_data.m_data[2].m_data[2] = 0.0;
  local_58.m_data.m_data[2].m_data[3] = 0.0;
  local_58.m_data.m_data[1].m_data[0] = 0.0;
  local_58.m_data.m_data[1].m_data[1] = 0.0;
  local_58.m_data.m_data[1].m_data[2] = 0.0;
  local_58.m_data.m_data[1].m_data[3] = 0.0;
  local_58.m_data.m_data[0].m_data[0] = 0.0;
  local_58.m_data.m_data[0].m_data[1] = 0.0;
  local_58.m_data.m_data[0].m_data[2] = 0.0;
  local_58.m_data.m_data[0].m_data[3] = 0.0;
  puVar3 = &DAT_0223f9c0;
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = *(undefined4 *)((long)puVar3 + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 1;
    puVar3 = puVar3 + 1;
  } while (lVar2 != 4);
  afStack_150[0] = 2.2041429e-38;
  afStack_150[1] = 0.0;
  tcu::operator-(&local_d8,&local_58);
  local_f0 = local_98;
  local_e8 = local_90;
  local_100 = local_84;
  local_f8 = local_7c;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  lVar2 = 0;
  do {
    local_138[lVar2] =
         *(float *)((long)&local_f0 + lVar2 * 4) + *(float *)((long)&local_100 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_110 = local_70;
  local_108 = local_78;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_120 = local_120 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    local_128[lVar2] = local_138[lVar2] + *(float *)((long)&local_110 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_e4 = local_5c;
  local_e0 = local_68;
  afStack_150[2] = 0.0;
  afStack_150[3] = 0.0;
  afStack_150[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_150[lVar2 + 2] = local_128[lVar2] + (&local_e4)[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_120 = 0x100000000;
  local_118 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_128[lVar2]] = afStack_150[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) - getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}